

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.h
# Opt level: O1

void __thiscall
crnlib::dxt_hc::color_cluster::color_cluster(color_cluster *this,color_cluster *param_1)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    puVar1 = (undefined8 *)((long)&this->blocks[0].m_p + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    elemental_vector::increase_capacity
              ((elemental_vector *)((long)&this->blocks[0].m_p + lVar4),
               *(uint *)((long)&param_1->blocks[0].m_size + lVar4),false,4,(object_mover)0x0,false);
    uVar2 = *(uint *)((long)&param_1->blocks[0].m_size + lVar4);
    *(uint *)((long)&this->blocks[0].m_size + lVar4) = uVar2;
    memcpy(*(void **)((long)&this->blocks[0].m_p + lVar4),
           *(void **)((long)&param_1->blocks[0].m_p + lVar4),(ulong)uVar2 << 2);
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x30);
  (this->pixels).m_p = (color_quad<unsigned_char,_int> *)0x0;
  (this->pixels).m_size = 0;
  (this->pixels).m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&this->pixels,(param_1->pixels).m_size,false,4,(object_mover)0x0,
             false);
  uVar2 = (param_1->pixels).m_size;
  (this->pixels).m_size = uVar2;
  memcpy((this->pixels).m_p,(param_1->pixels).m_p,(ulong)uVar2 << 2);
  uVar3 = param_1->second_endpoint;
  this->first_endpoint = param_1->first_endpoint;
  this->second_endpoint = uVar3;
  lVar4 = 0;
  do {
    this->color_values[lVar4].field_0.field_0.r = param_1->color_values[lVar4].field_0.field_0.r;
    this->color_values[lVar4].field_0.field_0.g = param_1->color_values[lVar4].field_0.field_0.g;
    this->color_values[lVar4].field_0.field_0.b = param_1->color_values[lVar4].field_0.field_0.b;
    this->color_values[lVar4].field_0.field_0.a = param_1->color_values[lVar4].field_0.field_0.a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return;
}

Assistant:

color_cluster() : first_endpoint(0), second_endpoint(0) {}